

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lsha1.c
# Opt level: O0

int lsha1(lua_State *L)

{
  uint8_t *data;
  undefined1 local_94 [8];
  SHA1_CTX ctx;
  uint8_t digest [20];
  uint8_t *buffer;
  size_t sz;
  lua_State *L_local;
  
  buffer = (uint8_t *)0x0;
  sz = (size_t)L;
  data = (uint8_t *)luaL_checklstring(L,1,(size_t *)&buffer);
  sat_SHA1_Init((SHA1_CTX *)local_94);
  sat_SHA1_Update((SHA1_CTX *)local_94,data,(size_t)buffer);
  sat_SHA1_Final((SHA1_CTX *)local_94,ctx.buffer + 0x38);
  lua_pushlstring((lua_State *)sz,(char *)(ctx.buffer + 0x38),0x14);
  return 1;
}

Assistant:

int
lsha1(lua_State *L) {
	size_t sz = 0;
	const uint8_t * buffer = (const uint8_t *)luaL_checklstring(L, 1, &sz);
	uint8_t digest[SHA1_DIGEST_SIZE];
	SHA1_CTX ctx;
	sat_SHA1_Init(&ctx);
	sat_SHA1_Update(&ctx, buffer, sz);
	sat_SHA1_Final(&ctx, digest);
	lua_pushlstring(L, (const char *)digest, SHA1_DIGEST_SIZE);

	return 1;
}